

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Discard.cc
# Opt level: O2

void __thiscall Pl_Discard::~Pl_Discard(Pl_Discard *this)

{
  Pipeline::~Pipeline(&this->super_Pipeline);
  operator_delete(this,0x30);
  return;
}

Assistant:

Pl_Discard::~Pl_Discard() = default;